

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::test_multiple_outputs0(APITests *this)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> channels;
  allocator_type local_29;
  void *local_28 [2];
  long local_18;
  int local_10;
  int local_c;
  
  GPIO::setmode(BOARD);
  local_10 = (this->pin_data).out_a;
  local_c = (this->pin_data).out_b;
  __l._M_len = 2;
  __l._M_array = &local_10;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_29);
  GPIO::setup((vector *)local_28,OUT,-1);
  GPIO::output((vector *)local_28,1);
  GPIO::output((vector *)local_28,0);
  GPIO::cleanup();
  if (local_28[0] != (void *)0x0) {
    operator_delete(local_28[0],local_18 - (long)local_28[0]);
  }
  return;
}

Assistant:

void test_multiple_outputs0()
    {
        GPIO::setmode(GPIO::BOARD);
        std::vector<int> channels = {pin_data.out_a, pin_data.out_b};
        GPIO::setup(channels, GPIO::OUT);
        GPIO::output(channels, GPIO::HIGH);
        GPIO::output(channels, GPIO::LOW);
        GPIO::cleanup();
    }